

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZnode.cpp
# Opt level: O2

void __thiscall
chrono::ChLoadXYZnodeBody::ComputeQ(ChLoadXYZnodeBody *this,ChState *state_x,ChStateDelta *state_w)

{
  ChVectorDynamic<> *vector;
  undefined1 auVar1 [16];
  shared_ptr<chrono::ChBody> mbodyB;
  shared_ptr<chrono::ChNodeXYZ> mnodeA;
  ChVector<double> v;
  ChVector<double> loc_ftorque;
  ChFrameMoving<double> local_428;
  ChVector<double> abs_force;
  ChFrameMoving<double> rel_AB;
  ChFrameMoving<double> local_218;
  ChFrameMoving<double> local_120;
  
  std::dynamic_pointer_cast<chrono::ChNodeXYZ,chrono::ChLoadable>
            ((shared_ptr<chrono::ChLoadable> *)&mnodeA);
  std::dynamic_pointer_cast<chrono::ChBody,chrono::ChLoadable>
            ((shared_ptr<chrono::ChLoadable> *)&mbodyB);
  local_218.super_ChFrame<double>._vptr_ChFrame = (_func_int **)&DAT_3ff0000000000000;
  rel_AB.super_ChFrame<double>.coord.pos.m_data[1] = 0.0;
  local_218.super_ChFrame<double>.coord.pos.m_data[2] = 0.0;
  rel_AB.super_ChFrame<double>._vptr_ChFrame = (_func_int **)0x0;
  rel_AB.super_ChFrame<double>.coord.pos.m_data[0] = 0.0;
  local_218.super_ChFrame<double>.coord.pos.m_data[0] = 0.0;
  local_218.super_ChFrame<double>.coord.pos.m_data[1] = 0.0;
  ChFrameMoving<double>::ChFrameMoving
            (&local_120,(ChVector<double> *)&rel_AB,(ChQuaternion<double> *)&local_218);
  rel_AB.super_ChFrame<double>._vptr_ChFrame = (_func_int **)&DAT_3ff0000000000000;
  local_428.super_ChFrame<double>.coord.pos.m_data[1] = 0.0;
  rel_AB.super_ChFrame<double>.coord.pos.m_data[2] = 0.0;
  local_428.super_ChFrame<double>._vptr_ChFrame = (_func_int **)0x0;
  local_428.super_ChFrame<double>.coord.pos.m_data[0] = 0.0;
  rel_AB.super_ChFrame<double>.coord.pos.m_data[0] = 0.0;
  rel_AB.super_ChFrame<double>.coord.pos.m_data[1] = 0.0;
  ChFrameMoving<double>::ChFrameMoving
            (&local_218,(ChVector<double> *)&local_428,(ChQuaternion<double> *)&rel_AB);
  if (state_x == (ChState *)0x0) {
    if (&local_120 !=
        (ChFrameMoving<double> *)
        mnodeA.super___shared_ptr<chrono::ChNodeXYZ,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
      local_120.super_ChFrame<double>.coord.pos.m_data[0] =
           ((mnodeA.super___shared_ptr<chrono::ChNodeXYZ,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->pos).
           m_data[0];
      local_120.super_ChFrame<double>.coord.pos.m_data[1] =
           ((mnodeA.super___shared_ptr<chrono::ChNodeXYZ,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->pos).
           m_data[1];
      local_120.super_ChFrame<double>.coord.pos.m_data[2] =
           ((mnodeA.super___shared_ptr<chrono::ChNodeXYZ,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->pos).
           m_data[2];
    }
    ChFrame<double>::SetCoord
              (&local_218.super_ChFrame<double>,
               &((mbodyB.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord);
  }
  else {
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&rel_AB,
               &state_x->super_ChVectorDynamic<double>,0,3);
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((ChVector<double> *)&local_428,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &rel_AB,(type *)0x0);
    local_120.super_ChFrame<double>.coord.pos.m_data[0] =
         (double)local_428.super_ChFrame<double>._vptr_ChFrame;
    local_120.super_ChFrame<double>.coord.pos.m_data[1] =
         local_428.super_ChFrame<double>.coord.pos.m_data[0];
    local_120.super_ChFrame<double>.coord.pos.m_data[2] =
         local_428.super_ChFrame<double>.coord.pos.m_data[1];
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_428,
               &state_x->super_ChVectorDynamic<double>,3,7);
    ChCoordsys<double>::ChCoordsys<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((ChCoordsys<double> *)&rel_AB,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_428,(type *)0x0);
    ChFrame<double>::SetCoord(&local_218.super_ChFrame<double>,(ChCoordsys<double> *)&rel_AB);
  }
  if (state_w == (ChStateDelta *)0x0) {
    if (&local_120.coord_dt !=
        (ChCoordsys<double> *)
        &(mnodeA.super___shared_ptr<chrono::ChNodeXYZ,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->pos_dt)
    {
      local_120.coord_dt.pos.m_data[0] =
           ((mnodeA.super___shared_ptr<chrono::ChNodeXYZ,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           pos_dt).m_data[0];
      local_120.coord_dt.pos.m_data[1] =
           ((mnodeA.super___shared_ptr<chrono::ChNodeXYZ,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           pos_dt).m_data[1];
      local_120.coord_dt.pos.m_data[2] =
           ((mnodeA.super___shared_ptr<chrono::ChNodeXYZ,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           pos_dt).m_data[2];
    }
    ChCoordsys<double>::operator=
              (&local_218.coord_dt,
               &((mbodyB.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt);
  }
  else {
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&rel_AB,
               &state_w->super_ChVectorDynamic<double>,0,3);
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((ChVector<double> *)&local_428,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &rel_AB,(type *)0x0);
    local_120.coord_dt.pos.m_data[0] = (double)local_428.super_ChFrame<double>._vptr_ChFrame;
    local_120.coord_dt.pos.m_data[1] = local_428.super_ChFrame<double>.coord.pos.m_data[0];
    local_120.coord_dt.pos.m_data[2] = local_428.super_ChFrame<double>.coord.pos.m_data[1];
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&rel_AB,
               &state_w->super_ChVectorDynamic<double>,3,3);
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((ChVector<double> *)&local_428,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &rel_AB,(type *)0x0);
    local_218.coord_dt.pos.m_data[0] = (double)local_428.super_ChFrame<double>._vptr_ChFrame;
    local_218.coord_dt.pos.m_data[1] = local_428.super_ChFrame<double>.coord.pos.m_data[0];
    local_218.coord_dt.pos.m_data[2] = local_428.super_ChFrame<double>.coord.pos.m_data[1];
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&rel_AB,
               &state_w->super_ChVectorDynamic<double>,6,3);
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((ChVector<double> *)&local_428,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &rel_AB,(type *)0x0);
    ChFrameMoving<double>::SetWvel_loc(&local_218,(ChVector<double> *)&local_428);
  }
  ChFrameMoving<double>::operator=(&this->frame_Aw,&local_120);
  ChFrameMoving<double>::ChFrameMoving(&local_428,&this->loc_application_B);
  ChFrameMoving<double>::operator>>(&rel_AB,&local_428,&local_218);
  ChFrameMoving<double>::operator=(&this->frame_Bw,&rel_AB);
  ChFrameMoving<double>::GetInverse(&local_428,&this->frame_Bw);
  ChFrameMoving<double>::operator>>(&rel_AB,&this->frame_Aw,&local_428);
  (*(this->super_ChLoadCustomMultiple).super_ChLoadBase.super_ChObj._vptr_ChObj[0x16])
            (this,&rel_AB,&this->computed_loc_force);
  ChMatrix33<double>::operator*
            (&(this->frame_Bw).super_ChFrame<double>.Amatrix,&this->computed_loc_force);
  vector = &(this->super_ChLoadCustomMultiple).load_Q;
  loc_ftorque.m_data[0] = (double)&abs_force;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_428,vector,0,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)&local_428,
             (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&loc_ftorque);
  auVar1._8_8_ = local_218.super_ChFrame<double>.coord.pos.m_data[1];
  auVar1._0_8_ = local_218.super_ChFrame<double>.coord.pos.m_data[0];
  v.m_data._0_16_ =
       vsubpd_avx(*(undefined1 (*) [16])(this->frame_Bw).super_ChFrame<double>.coord.pos.m_data,
                  auVar1);
  v.m_data[2] = (this->frame_Bw).super_ChFrame<double>.coord.pos.m_data[2] -
                local_218.super_ChFrame<double>.coord.pos.m_data[2];
  ChVector<double>::operator%((ChVector<double> *)&local_428,&v,&abs_force);
  ChQuaternion<double>::RotateBack
            (&local_218.super_ChFrame<double>.coord.rot,(ChVector<double> *)&local_428);
  v.m_data[0] = (double)&abs_force;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_428,vector,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>const>>
            ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)&local_428,
             (CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)&v);
  v.m_data[0] = (double)&loc_ftorque;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_428,vector,6,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>const>>
            ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)&local_428,
             (CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)&v);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mbodyB.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mnodeA.super___shared_ptr<chrono::ChNodeXYZ,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void ChLoadXYZnodeBody::ComputeQ(ChState* state_x, ChStateDelta* state_w) {
    auto mnodeA = std::dynamic_pointer_cast<ChNodeXYZ>(this->loadables[0]);
    auto mbodyB = std::dynamic_pointer_cast<ChBody>(this->loadables[1]);

    ChFrameMoving<> bodycoordA, bodycoordB;
    if (state_x) {
        // the numerical jacobian algo might change state_x
        bodycoordA.SetPos(state_x->segment(0, 3));
        bodycoordB.SetCoord(state_x->segment(3, 7));
    } else {
        bodycoordA.SetPos(mnodeA->pos);
        bodycoordB.SetCoord(mbodyB->coord);
    }

    if (state_w) {
        // the numerical jacobian algo might change state_w
        bodycoordA.SetPos_dt(state_w->segment(0, 3));
        bodycoordB.SetPos_dt(state_w->segment(3, 3));
        bodycoordB.SetWvel_loc(state_w->segment(6, 3));
    } else {
        bodycoordA.SetPos_dt(mnodeA->GetPos_dt());
        bodycoordB.SetCoord_dt(mbodyB->GetCoord_dt());
    }

    frame_Aw = bodycoordA;
    frame_Bw = ChFrameMoving<>(loc_application_B) >> bodycoordB;
    ChFrameMoving<> rel_AB = frame_Aw >> frame_Bw.GetInverse();

    // COMPUTE THE FORCE

    ComputeForce(rel_AB, computed_loc_force);

    ChVector<> abs_force = frame_Bw.TransformDirectionLocalToParent(computed_loc_force);

    // Compute Q
    load_Q.segment(0, 3) = abs_force.eigen();

    ChVector<> loc_ftorque = bodycoordB.GetRot().RotateBack(((frame_Bw.GetPos() - bodycoordB.GetPos()) % abs_force));
    load_Q.segment(3, 3) = -abs_force.eigen();
    load_Q.segment(6, 3) = -loc_ftorque.eigen();
}